

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::join(CBString *this,CBStringList *l)

{
  const_reference pvVar1;
  CBStringException *pCVar2;
  int len;
  ulong uVar3;
  allocator local_b1;
  CBStringException bstr__cppwrapper_exception;
  string local_88;
  string local_68;
  string local_48;
  
  if ((this->super_tagbstring).mlen < 1) {
    std::__cxx11::string::string((string *)&local_48,"CBString::Write protection error",&local_b1);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  len = 1;
  uVar3 = 0;
  do {
    if ((ulong)((*(long *)(l + 8) - *(long *)l) / 0x18) <= uVar3) {
      alloc(this,len);
      (this->super_tagbstring).slen = 0;
      if ((this->super_tagbstring).data != (uchar *)0x0) {
        for (uVar3 = 0; uVar3 < (ulong)((*(long *)(l + 8) - *(long *)l) / 0x18); uVar3 = uVar3 + 1)
        {
          pvVar1 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                             ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,
                              uVar3);
          operator+=(this,pvVar1);
        }
        return;
      }
      (this->super_tagbstring).mlen = 0;
      std::__cxx11::string::string
                ((string *)&local_88,"CBString::Failure in (CBStringList) constructor",&local_b1);
      CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
      __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    pvVar1 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                       ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,uVar3);
    uVar3 = uVar3 + 1;
    len = len + (pvVar1->super_tagbstring).slen;
  } while (-1 < len);
  std::__cxx11::string::string
            ((string *)&local_68,"CBString::Failure in (CBStringList) constructor, too long",
             &local_b1);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::join (const struct CBStringList& l) {
int c;
size_t i;

	if (mlen <= 0) {
		bstringThrow ("Write protection error");
	}

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen;
		if (c < 0) bstringThrow ("Failure in (CBStringList) constructor, too long");
	}

	alloc (c);
	slen = 0;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			*this += l.at(i);
		}
	}
}